

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O2

int tinf_uncompress(void *dest,uint *destLen,void *source,uint sourceLen)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  tinf_data local_678;
  byte local_178 [256];
  char local_78;
  
  local_678.source_end = (uchar *)((ulong)sourceLen + (long)source);
  local_678.tag = 0;
  local_678.bitcount = 0;
  local_678.overflow = 0;
  local_678.dest_end = (uchar *)((ulong)*destLen + (long)dest);
  local_678.source = (uchar *)source;
  local_678.dest_start = (uchar *)dest;
  local_678.dest = (uchar *)dest;
  do {
    lVar9 = 0x1c;
    uVar2 = tinf_getbits(&local_678,1);
    uVar3 = tinf_getbits(&local_678,2);
    if (uVar3 == 0) {
      if ((long)local_678.source_end - (long)local_678.source < 4) {
        return -3;
      }
      uVar1 = *(ushort *)local_678.source;
      uVar3 = (uint)uVar1;
      if ((*(ushort *)((long)local_678.source + 2) ^ uVar1) != 0xffff) {
        return -3;
      }
      local_678.source = (uchar *)((long)local_678.source + 4);
      if ((long)local_678.source_end - (long)local_678.source < (long)(ulong)uVar1) {
        return -3;
      }
      if ((long)local_678.dest_end - (long)local_678.dest < (long)(ulong)uVar1) {
        return -5;
      }
      while (bVar11 = uVar3 != 0, uVar3 = uVar3 - 1, bVar11) {
        uVar1 = *(ushort *)local_678.source;
        local_678.source = (uchar *)((long)local_678.source + 1);
        *local_678.dest = (uchar)uVar1;
        local_678.dest = local_678.dest + 1;
      }
      local_678.tag = 0;
      local_678.bitcount = 0;
    }
    else {
      if (uVar3 == 2) {
        uVar3 = tinf_getbits(&local_678,5);
        uVar3 = uVar3 + 0x101;
        uVar4 = tinf_getbits(&local_678,5);
        uVar5 = tinf_getbits(&local_678,4);
        if (0x11e < uVar3) {
          return -3;
        }
        uVar4 = uVar4 + 1;
        if (0x1e < uVar4) {
          return -3;
        }
        for (lVar9 = 0; lVar9 != 0x13; lVar9 = lVar9 + 1) {
          local_178[lVar9] = 0;
        }
        for (uVar10 = 0; uVar5 + 4 != uVar10; uVar10 = uVar10 + 1) {
          uVar7 = tinf_getbits(&local_678,3);
          local_178[(byte)(&tinf_decode_trees_clcidx)[uVar10]] = (byte)uVar7;
        }
        iVar6 = tinf_build_tree(&local_678.ltree,local_178,0x13);
        if (iVar6 != 0) {
          return iVar6;
        }
        if (local_678.ltree.max_sym == -1) {
          return -3;
        }
        uVar5 = 0;
        while (uVar5 < uVar4 + uVar3) {
          uVar7 = tinf_decode_symbol(&local_678,&local_678.ltree);
          if (local_678.ltree.max_sym < (int)uVar7) {
            return -3;
          }
          if ((short)uVar7 == 0x12) {
            uVar8 = tinf_getbits(&local_678,7);
            uVar8 = uVar8 + 0xb;
LAB_0010195e:
            uVar7 = 0;
          }
          else {
            if ((uVar7 & 0xffff) == 0x11) {
              uVar8 = tinf_getbits(&local_678,3);
              uVar8 = uVar8 + 3;
              goto LAB_0010195e;
            }
            if ((uVar7 & 0xffff) == 0x10) {
              if (uVar5 == 0) {
                return -3;
              }
              uVar7 = (uint)local_178[uVar5 - 1];
              uVar8 = tinf_getbits(&local_678,2);
              uVar8 = uVar8 + 3;
            }
            else {
              uVar8 = 1;
            }
          }
          if ((uVar4 + uVar3) - uVar5 < uVar8) {
            return -3;
          }
          while (bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11) {
            uVar10 = (ulong)uVar5;
            uVar5 = uVar5 + 1;
            local_178[uVar10] = (byte)uVar7;
          }
        }
        if (local_78 == '\0') {
          return -3;
        }
        iVar6 = tinf_build_tree(&local_678.ltree,local_178,uVar3);
        if (iVar6 != 0) {
          return iVar6;
        }
        iVar6 = tinf_build_tree(&local_678.dtree,local_178 + uVar3,uVar4);
        if (iVar6 != 0) {
          return iVar6;
        }
        iVar6 = tinf_inflate_block_data(&local_678,&local_678.ltree,&local_678.dtree);
      }
      else {
        if (uVar3 != 1) {
          return -3;
        }
        for (; lVar9 != 0x2c; lVar9 = lVar9 + 1) {
          local_678.ltree.counts[lVar9 + -0x1c] = 0;
        }
        local_678.ltree.counts[7] = 0x18;
        local_678.ltree.counts[8] = 0x98;
        local_678.ltree.counts[9] = 0x70;
        for (lVar9 = 0x2c; lVar9 != 0x44; lVar9 = lVar9 + 1) {
          local_678.ltree.counts[lVar9 + -0x1c] = (short)lVar9 + 0xd4;
        }
        for (lVar9 = 0; lVar9 != 0x90; lVar9 = lVar9 + 1) {
          local_678.ltree.symbols[lVar9 + 0x18] = (unsigned_short)lVar9;
        }
        for (lVar9 = 0xd4; lVar9 != 0xdc; lVar9 = lVar9 + 1) {
          local_678.ltree.counts[lVar9 + -0x1c] = (short)lVar9 + 0x44;
        }
        for (lVar9 = 0xdc; lVar9 != 0x14c; lVar9 = lVar9 + 1) {
          local_678.ltree.counts[lVar9 + -0x1c] = (short)lVar9 - 0x4c;
        }
        local_678.ltree.max_sym = 0x11d;
        for (lVar9 = 0x14e; lVar9 != 0x15e; lVar9 = lVar9 + 1) {
          local_678.ltree.counts[lVar9 + -0x1c] = 0;
        }
        local_678.dtree.counts[5] = 0x20;
        for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
          local_678.dtree.symbols[lVar9] = (unsigned_short)lVar9;
        }
        local_678.dtree.max_sym = 0x1d;
        iVar6 = tinf_inflate_block_data(&local_678,&local_678.ltree,&local_678.dtree);
      }
      if (iVar6 != 0) {
        return iVar6;
      }
    }
    if (uVar2 != 0) {
      iVar6 = -3;
      if (local_678.overflow == 0) {
        *destLen = (int)local_678.dest - (int)local_678.dest_start;
        iVar6 = 0;
      }
      return iVar6;
    }
  } while( true );
}

Assistant:

int tinf_uncompress(void *dest, unsigned int *destLen,
                    const void *source, unsigned int sourceLen)
{
	struct tinf_data d;
	int bfinal;

	/* Initialise data */
	d.source = (const unsigned char *) source;
	d.source_end = d.source + sourceLen;
	d.tag = 0;
	d.bitcount = 0;
	d.overflow = 0;

	d.dest = (unsigned char *) dest;
	d.dest_start = d.dest;
	d.dest_end = d.dest + *destLen;

	do {
		unsigned int btype;
		int res;

		/* Read final block flag */
		bfinal = tinf_getbits(&d, 1);

		/* Read block type (2 bits) */
		btype = tinf_getbits(&d, 2);

		/* Decompress block */
		switch (btype) {
		case 0:
			/* Decompress uncompressed block */
			res = tinf_inflate_uncompressed_block(&d);
			break;
		case 1:
			/* Decompress block with fixed Huffman trees */
			res = tinf_inflate_fixed_block(&d);
			break;
		case 2:
			/* Decompress block with dynamic Huffman trees */
			res = tinf_inflate_dynamic_block(&d);
			break;
		default:
			res = TINF_DATA_ERROR;
			break;
		}

		if (res != TINF_OK) {
			return res;
		}
	} while (!bfinal);

	/* Check for overflow in bit reader */
	if (d.overflow) {
		return TINF_DATA_ERROR;
	}

	*destLen = d.dest - d.dest_start;

	return TINF_OK;
}